

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::Loop::GetInductionInitValue(Loop *this,Instruction *induction,int64_t *value)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  DefUseManager *this_00;
  CFG *this_01;
  BasicBlock *bb_00;
  ConstantManager *this_02;
  Constant *this_03;
  Type *pTVar4;
  undefined4 extraout_var;
  uint64_t local_88;
  Integer *type;
  Constant *constant;
  BasicBlock *bb;
  uint32_t operand_id;
  DefUseManager *def_use_manager;
  Instruction *constant_instruction;
  int64_t *value_local;
  Instruction *induction_local;
  Loop *this_local;
  
  def_use_manager = (DefUseManager *)0x0;
  this_00 = IRContext::get_def_use_mgr(this->context_);
  for (bb._4_4_ = 0; uVar2 = Instruction::NumInOperands(induction), bb._4_4_ < uVar2;
      bb._4_4_ = bb._4_4_ + 2) {
    this_01 = IRContext::cfg(this->context_);
    uVar2 = Instruction::GetSingleWordInOperand(induction,bb._4_4_ + 1);
    bb_00 = CFG::block(this_01,uVar2);
    bVar1 = IsInsideLoop(this,bb_00);
    if (!bVar1) {
      uVar2 = Instruction::GetSingleWordInOperand(induction,bb._4_4_);
      def_use_manager = (DefUseManager *)analysis::DefUseManager::GetDef(this_00,uVar2);
    }
  }
  if (def_use_manager == (DefUseManager *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_02 = IRContext::get_constant_mgr(this->context_);
    uVar2 = Instruction::result_id((Instruction *)def_use_manager);
    this_03 = analysis::ConstantManager::FindDeclaredConstant(this_02,uVar2);
    if (this_03 == (Constant *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      if (value != (int64_t *)0x0) {
        pTVar4 = analysis::Constant::type(this_03);
        iVar3 = (*pTVar4->_vptr_Type[10])();
        if ((Integer *)CONCAT44(extraout_var,iVar3) == (Integer *)0x0) {
          return false;
        }
        bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var,iVar3));
        if (bVar1) {
          local_88 = analysis::Constant::GetSignExtendedValue(this_03);
        }
        else {
          local_88 = analysis::Constant::GetZeroExtendedValue(this_03);
        }
        *value = local_88;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Loop::GetInductionInitValue(const Instruction* induction,
                                 int64_t* value) const {
  Instruction* constant_instruction = nullptr;
  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  for (uint32_t operand_id = 0; operand_id < induction->NumInOperands();
       operand_id += 2) {
    BasicBlock* bb = context_->cfg()->block(
        induction->GetSingleWordInOperand(operand_id + 1));

    if (!IsInsideLoop(bb)) {
      constant_instruction = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id));
    }
  }

  if (!constant_instruction) return false;

  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(
          constant_instruction->result_id());
  if (!constant) return false;

  if (value) {
    const analysis::Integer* type = constant->type()->AsInteger();
    if (!type) {
      return false;
    }

    *value = type->IsSigned() ? constant->GetSignExtendedValue()
                              : constant->GetZeroExtendedValue();
  }

  return true;
}